

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

bool __thiscall
rapidjson::internal::
Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
::EndValue(Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
           *this,Context *context)

{
  ulong uVar1;
  byte bVar2;
  uint uVar4;
  undefined4 extraout_var;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  Ch *pCVar5;
  ulong uVar6;
  ulong uVar7;
  ISchemaValidator **ppIVar8;
  ErrorHandlerType *pEVar9;
  uint uVar10;
  bool bVar11;
  int iVar3;
  
  uVar4 = context->patternPropertiesValidatorCount;
  uVar7 = (ulong)uVar4;
  if (uVar4 != 0) {
    bVar2 = 0;
    if (context->objectPatternValidatorType == kPatternValidatorOnly) {
LAB_001485ac:
      iVar3 = (*(*context->patternPropertiesValidators)->_vptr_ISchemaValidator[2])();
      if ((char)iVar3 == '\0') {
        bVar11 = false;
      }
      else {
        uVar1 = 1;
        do {
          uVar6 = uVar1;
          if (uVar7 == uVar6) break;
          iVar3 = (*context->patternPropertiesValidators[uVar6]->_vptr_ISchemaValidator[2])();
          uVar1 = uVar6 + 1;
        } while ((char)iVar3 != '\0');
        bVar11 = uVar7 <= uVar6;
      }
    }
    else {
      uVar7 = (ulong)(uVar4 - 1);
      iVar3 = (*context->patternPropertiesValidators[uVar7]->_vptr_ISchemaValidator[2])();
      bVar2 = (byte)iVar3;
      if (uVar4 - 1 != 0) goto LAB_001485ac;
      bVar11 = true;
      uVar7 = 0;
    }
    if (context->objectPatternValidatorType == kPatternValidatorWithProperty) {
      if ((bVar2 & bVar11) == 0) {
LAB_0014875c:
        pEVar9 = context->error_handler;
        ppIVar8 = context->patternPropertiesValidators;
        uVar7 = (ulong)((int)uVar7 + 1);
LAB_00148767:
        (*pEVar9->_vptr_IValidationErrorHandler[0x17])(pEVar9,ppIVar8,uVar7);
        context->invalidCode = kValidateErrorPatternProperties;
        this_00 = GetPatternPropertiesString();
        goto LAB_0014877f;
      }
    }
    else if (context->objectPatternValidatorType == kPatternValidatorOnly) {
      if (bVar11 == false) {
        pEVar9 = context->error_handler;
        ppIVar8 = context->patternPropertiesValidators;
        goto LAB_00148767;
      }
    }
    else if (bVar2 == 0 && bVar11 == false) goto LAB_0014875c;
  }
  if ((this->enum_ != (uint64_t *)0x0) && (context->hasher != (void *)0x0)) {
    iVar3 = (*context->factory->_vptr_ISchemaStateFactory[5])();
    if ((ulong)this->enumCount_ != 0) {
      uVar7 = 0;
      do {
        if (this->enum_[uVar7] == CONCAT44(extraout_var,iVar3)) goto LAB_00148680;
        uVar7 = uVar7 + 1;
      } while (this->enumCount_ != uVar7);
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[0x1f])(context->error_handler,0x13);
    context->invalidCode = kValidateErrorEnum;
    this_00 = GetEnumString();
    goto LAB_0014877f;
  }
LAB_00148680:
  if (context->validatorCount == 0) {
    return true;
  }
  if ((this->allOf_).schemas != (SchemaType **)0x0) {
    uVar4 = (this->allOf_).begin;
    uVar7 = (ulong)uVar4;
    if (uVar4 < (this->allOf_).count + uVar4) {
      do {
        iVar3 = (*context->validators[uVar7]->_vptr_ISchemaValidator[2])();
        if ((char)iVar3 == '\0') {
          (*context->error_handler->_vptr_IValidationErrorHandler[0x23])
                    (context->error_handler,context->validators + (this->allOf_).begin,
                     (ulong)(this->allOf_).count);
          context->invalidCode = kValidateErrorAllOf;
          this_00 = GetAllOfString();
          goto LAB_0014877f;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (this->allOf_).count + (this->allOf_).begin);
    }
  }
  if ((this->anyOf_).schemas != (SchemaType **)0x0) {
    uVar4 = (this->anyOf_).begin;
    uVar7 = (ulong)uVar4;
    if (uVar4 < (this->anyOf_).count + uVar4) {
      do {
        iVar3 = (*context->validators[uVar7]->_vptr_ISchemaValidator[2])();
        if ((char)iVar3 != '\0') goto LAB_0014879e;
        uVar7 = uVar7 + 1;
        uVar4 = (this->anyOf_).begin;
      } while (uVar7 < (this->anyOf_).count + uVar4);
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[0x24])
              (context->error_handler,context->validators + uVar4);
    context->invalidCode = kValidateErrorAnyOf;
    this_00 = GetAnyOfString();
    goto LAB_0014877f;
  }
LAB_0014879e:
  if ((this->oneOf_).schemas == (SchemaType **)0x0) {
LAB_00148817:
    if (this->not_ == (SchemaType *)0x0) {
      return true;
    }
    iVar3 = (*context->validators[this->notValidatorIndex_]->_vptr_ISchemaValidator[2])();
    if ((char)iVar3 == '\0') {
      return true;
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[0x27])();
    context->invalidCode = kValidateErrorNot;
    this_00 = GetNotString();
  }
  else {
    uVar4 = (this->oneOf_).begin;
    uVar7 = (ulong)uVar4;
    if (uVar4 < (this->oneOf_).count + uVar4) {
      uVar10 = 0;
      bVar11 = false;
      do {
        iVar3 = (*context->validators[uVar7]->_vptr_ISchemaValidator[2])();
        if ((char)iVar3 == '\0') {
          uVar4 = (this->oneOf_).begin;
        }
        else {
          if (bVar11) {
            (*context->error_handler->_vptr_IValidationErrorHandler[0x26])
                      (context->error_handler,(ulong)uVar10,
                       (ulong)((int)uVar7 - (this->oneOf_).begin));
            context->invalidCode = kValidateErrorOneOfMatch;
            goto LAB_001488d5;
          }
          uVar4 = (this->oneOf_).begin;
          uVar10 = (int)uVar7 - uVar4;
          bVar11 = true;
        }
        uVar7 = uVar7 + 1;
      } while (uVar7 < (this->oneOf_).count + uVar4);
      if (bVar11) goto LAB_00148817;
    }
    (*context->error_handler->_vptr_IValidationErrorHandler[0x25])
              (context->error_handler,context->validators + uVar4);
    context->invalidCode = kValidateErrorOneOf;
LAB_001488d5:
    this_00 = GetOneOfString();
  }
LAB_0014877f:
  pCVar5 = GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
           ::GetString(this_00);
  context->invalidKeyword = pCVar5;
  return false;
}

Assistant:

RAPIDJSON_FORCEINLINE bool EndValue(Context& context) const {
        RAPIDJSON_SCHEMA_PRINT(Method, "Schema::EndValue");
        // Only check pattern properties if we have validators
        if (context.patternPropertiesValidatorCount > 0) {
            bool otherValid = false;
            SizeType count = context.patternPropertiesValidatorCount;
            if (context.objectPatternValidatorType != Context::kPatternValidatorOnly)
                otherValid = context.patternPropertiesValidators[--count]->IsValid();

            bool patternValid = true;
            for (SizeType i = 0; i < count; i++)
                if (!context.patternPropertiesValidators[i]->IsValid()) {
                    patternValid = false;
                    break;
                }

            if (context.objectPatternValidatorType == Context::kPatternValidatorOnly) {
                if (!patternValid) {
                    context.error_handler.PropertyViolations(context.patternPropertiesValidators, count);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPatternProperties);
                }
            }
            else if (context.objectPatternValidatorType == Context::kPatternValidatorWithProperty) {
                if (!patternValid || !otherValid) {
                    context.error_handler.PropertyViolations(context.patternPropertiesValidators, count + 1);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPatternProperties);
                }
            }
            else if (!patternValid && !otherValid) { // kPatternValidatorWithAdditionalProperty)
                context.error_handler.PropertyViolations(context.patternPropertiesValidators, count + 1);
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorPatternProperties);
            }
        }

        // For enums only check if we have a hasher
        if (enum_ && context.hasher) {
            const uint64_t h = context.factory.GetHashCode(context.hasher);
            for (SizeType i = 0; i < enumCount_; i++)
                if (enum_[i] == h)
                    goto foundEnum;
            context.error_handler.DisallowedValue(kValidateErrorEnum);
            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorEnum);
            foundEnum:;
        }

        // Only check allOf etc if we have validators
        if (context.validatorCount > 0) {
            if (allOf_.schemas)
                for (SizeType i = allOf_.begin; i < allOf_.begin + allOf_.count; i++)
                    if (!context.validators[i]->IsValid()) {
                        context.error_handler.NotAllOf(&context.validators[allOf_.begin], allOf_.count);
                        RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorAllOf);
                    }

            if (anyOf_.schemas) {
                for (SizeType i = anyOf_.begin; i < anyOf_.begin + anyOf_.count; i++)
                    if (context.validators[i]->IsValid())
                        goto foundAny;
                context.error_handler.NoneOf(&context.validators[anyOf_.begin], anyOf_.count);
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorAnyOf);
                foundAny:;
            }

            if (oneOf_.schemas) {
                bool oneValid = false;
                SizeType firstMatch = 0;
                for (SizeType i = oneOf_.begin; i < oneOf_.begin + oneOf_.count; i++)
                    if (context.validators[i]->IsValid()) {
                        if (oneValid) {
                            context.error_handler.MultipleOneOf(firstMatch, i - oneOf_.begin);
                            RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorOneOfMatch);
                        } else {
                            oneValid = true;
                            firstMatch = i - oneOf_.begin;
                        }
                    }
                if (!oneValid) {
                    context.error_handler.NotOneOf(&context.validators[oneOf_.begin], oneOf_.count);
                    RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorOneOf);
                }
            }

            if (not_ && context.validators[notValidatorIndex_]->IsValid()) {
                context.error_handler.Disallowed();
                RAPIDJSON_INVALID_KEYWORD_RETURN(kValidateErrorNot);
            }
        }

        return true;
    }